

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O2

void Dau_DsdMergeVarPres(char *pDsd,int *pMatches,int *pPres,int Mask)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  iVar3 = 0;
  do {
    lVar4 = (long)iVar3;
    bVar1 = pDsd[lVar4];
    if (bVar1 == 0x3c) {
      if (pDsd[(long)pMatches[lVar4] + 1] == '{') {
        iVar3 = pMatches[lVar4] + 1;
      }
      lVar4 = (long)iVar3;
      bVar1 = pDsd[lVar4];
    }
    else if (bVar1 == 0) {
      return;
    }
    if ((byte)(bVar1 + 0xbf) < 6 || (byte)(bVar1 - 0x30) < 10) {
      lVar6 = (lVar4 << 0x20) + -0x100000000;
      iVar3 = (int)lVar4 + -1;
      pcVar5 = pDsd + lVar4;
      do {
        cVar2 = *pcVar5;
        lVar6 = lVar6 + 0x100000000;
        iVar3 = iVar3 + 1;
        pcVar5 = pcVar5 + 1;
      } while ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0xbfU) < 6);
      bVar1 = pDsd[lVar6 >> 0x20];
    }
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      if (0x6c < bVar1) {
        __assert_fail("pDsd[i]-\'a\' < DAU_MAX_VAR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0xc1,"void Dau_DsdMergeVarPres(char *, int *, int *, int)");
      }
      pPres[(ulong)bVar1 - 0x61] = pPres[(ulong)bVar1 - 0x61] | Mask;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static inline void Dau_DsdMergeVarPres( char * pDsd, int * pMatches, int * pPres, int Mask )
{
    int i;
    for ( i = 0; pDsd[i]; i++ )
    {
        // skip non-DSD block
        if ( pDsd[i] == '<' && pDsd[pMatches[i]+1] == '{' )
            i = pMatches[i] + 1;
        if ( (pDsd[i] >= 'A' && pDsd[i] <= 'F') || (pDsd[i] >= '0' && pDsd[i] <= '9') )
            while ( (pDsd[i] >= 'A' && pDsd[i] <= 'F') || (pDsd[i] >= '0' && pDsd[i] <= '9') )
                i++;
        // skip non-variables
        if ( !(pDsd[i] >= 'a' && pDsd[i] <= 'z') )
            continue;
        // record the mask
        assert( pDsd[i]-'a' < DAU_MAX_VAR );
        pPres[pDsd[i]-'a'] |= Mask;
    }
}